

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map.cc
# Opt level: O1

void __thiscall
bloaty::RangeMap::AddDualRange
          (RangeMap *this,uint64_t addr,uint64_t size,uint64_t otheraddr,string *label)

{
  pointer pcVar1;
  iterator iter;
  pointer pcVar2;
  iterator iVar3;
  uint64_t uVar4;
  pointer pcVar5;
  pointer pcVar6;
  _Base_ptr p_Var7;
  bool bVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  uint64_t local_90;
  pointer pcStack_88;
  undefined1 local_80 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  uint64_t local_58;
  pointer pcStack_50;
  _Base_ptr local_48;
  long local_40;
  pointer local_38;
  
  if (2 < verbose_level) {
    printf("%p AddDualRange([%lx, %lx], %lx, %s)\n",this,addr,size,otheraddr,
           (label->_M_dataplus)._M_p);
  }
  if (size == 0) {
    return;
  }
  iter = FindContainingOrAfter(this,addr);
  if (size != 0xffffffffffffffff) {
    pcVar6 = (pointer)(size + addr);
    if (CARRY8(size,addr)) {
      __assert_fail("end >= addr",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/range_map.cc"
                    ,0xd0,
                    "void bloaty::RangeMap::AddDualRange(uint64_t, uint64_t, uint64_t, const std::string &)"
                   );
    }
    p_Var7 = &(this->mappings_)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_40 = otheraddr - addr;
    local_48 = p_Var7;
    do {
      bVar8 = pcVar6 <= addr;
      if (p_Var7 != iter._M_node && !bVar8) {
        while ((*(pointer *)(iter._M_node + 1) <= addr &&
               (pcVar2 = (pointer)RangeEndUnknownLimit
                                            (this,(const_iterator)iter._M_node,0xffffffffffffffff),
               addr < pcVar2))) {
          MaybeSetLabel<std::_Rb_tree_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
                    (this,(_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
                           )iter._M_node,label,addr,(long)pcVar6 - addr);
          addr = RangeEndUnknownLimit(this,(const_iterator)iter._M_node,addr);
          iter._M_node = (_Base_ptr)std::_Rb_tree_increment(iter._M_node);
          bVar8 = pcVar6 <= addr;
          if ((bVar8) || (p_Var7 == iter._M_node)) break;
        }
      }
      if (bVar8) {
        return;
      }
      pcVar2 = pcVar6;
      if (((iter._M_node != p_Var7) && (pcVar5 = *(pointer *)(iter._M_node + 1), pcVar5 < pcVar6))
         && (pcVar2 = pcVar5, pcVar5 < addr)) {
        __assert_fail("it->first >= addr",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/range_map.cc"
                      ,0xe4,
                      "void bloaty::RangeMap::AddDualRange(uint64_t, uint64_t, uint64_t, const std::string &)"
                     );
      }
      local_38 = pcVar2;
      if (pcVar2 < addr) {
        __assert_fail("this_end >= addr",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/range_map.cc"
                      ,0xea,
                      "void bloaty::RangeMap::AddDualRange(uint64_t, uint64_t, uint64_t, const std::string &)"
                     );
      }
      pcVar5 = (pointer)(addr + local_40);
      if (otheraddr == 0xffffffffffffffff) {
        pcVar5 = (pointer)0xffffffffffffffff;
      }
      local_b0 = &local_a0;
      pcVar1 = (label->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar1,pcVar1 + label->_M_string_length);
      if (local_b0 == &local_a0) {
        local_68._8_8_ = local_a0._8_8_;
        local_80._8_8_ = &local_68;
      }
      else {
        local_80._8_8_ = local_b0;
      }
      local_68._M_allocated_capacity._1_7_ = local_a0._M_allocated_capacity._1_7_;
      local_68._M_local_buf[0] = local_a0._M_local_buf[0];
      local_80._16_8_ = local_a8;
      local_a8 = 0;
      local_a0._M_local_buf[0] = '\0';
      local_b0 = &local_a0;
      local_90 = (long)pcVar2 - addr;
      pcStack_88 = pcVar5;
      local_80._0_8_ = addr;
      local_58 = (long)pcVar2 - addr;
      pcStack_50 = pcVar5;
      iVar3 = std::
              _Rb_tree<unsigned_long,std::pair<unsigned_long_const,bloaty::RangeMap::Entry>,std::_Select1st<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
              ::_M_emplace_hint_unique<std::pair<unsigned_long,bloaty::RangeMap::Entry>>
                        ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,bloaty::RangeMap::Entry>,std::_Select1st<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
                          *)this,iter._M_node,
                         (pair<unsigned_long,_bloaty::RangeMap::Entry> *)local_80);
      p_Var7 = local_48;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._8_8_ != &local_68) {
        operator_delete((void *)local_80._8_8_,local_68._M_allocated_capacity + 1);
      }
      addr = (uint64_t)local_38;
      if (local_b0 != &local_a0) {
        operator_delete(local_b0,CONCAT71(local_a0._M_allocated_capacity._1_7_,
                                          local_a0._M_local_buf[0]) + 1);
      }
      if (2 < verbose_level) {
        EntryDebugString<std::_Rb_tree_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
                  ((string *)local_80,this,
                   (_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>)
                   iVar3._M_node);
        printf("  added entry: %s\n",local_80._0_8_);
        if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
          operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
        }
      }
      CheckConsistency<std::_Rb_tree_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
                (this,(_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>)
                      iVar3._M_node);
    } while( true );
  }
  if (otheraddr != 0xffffffffffffffff) {
    __assert_fail("otheraddr == kNoTranslation",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/range_map.cc"
                  ,0xc1,
                  "void bloaty::RangeMap::AddDualRange(uint64_t, uint64_t, uint64_t, const std::string &)"
                 );
  }
  if ((_Rb_tree_header *)iter._M_node != &(this->mappings_)._M_t._M_impl.super__Rb_tree_header) {
    if (iter._M_node[2]._M_parent == (_Base_ptr)0xffffffffffffffff) {
      bVar8 = *(ulong *)(iter._M_node + 1) == addr;
    }
    else {
      if (addr < *(ulong *)(iter._M_node + 1)) goto LAB_00197cc9;
      uVar4 = RangeEndUnknownLimit(this,(const_iterator)iter._M_node,0xffffffffffffffff);
      bVar8 = addr < uVar4;
    }
    if (bVar8) {
      MaybeSetLabel<std::_Rb_tree_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
                (this,(_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>)
                      iter._M_node,label,addr,0xffffffffffffffff);
      return;
    }
  }
LAB_00197cc9:
  pcVar6 = (label->_M_dataplus)._M_p;
  local_b0 = &local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar6,pcVar6 + label->_M_string_length);
  local_90 = 0xffffffffffffffff;
  pcStack_88 = (pointer)0xffffffffffffffff;
  if (local_b0 == &local_a0) {
    local_68._8_8_ = local_a0._8_8_;
    local_80._8_8_ = &local_68;
  }
  else {
    local_80._8_8_ = local_b0;
  }
  local_68._M_allocated_capacity._1_7_ = local_a0._M_allocated_capacity._1_7_;
  local_68._M_local_buf[0] = local_a0._M_local_buf[0];
  local_80._16_8_ = local_a8;
  local_a8 = 0;
  local_a0._M_local_buf[0] = '\0';
  local_58 = 0xffffffffffffffff;
  pcStack_50 = (pointer)0xffffffffffffffff;
  local_b0 = &local_a0;
  local_80._0_8_ = addr;
  iVar3 = std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,bloaty::RangeMap::Entry>,std::_Select1st<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
          ::_M_emplace_hint_unique<std::pair<unsigned_long,bloaty::RangeMap::Entry>>
                    ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,bloaty::RangeMap::Entry>,std::_Select1st<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
                      *)this,iter._M_node,(pair<unsigned_long,_bloaty::RangeMap::Entry> *)local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._8_8_ != &local_68) {
    operator_delete((void *)local_80._8_8_,local_68._M_allocated_capacity + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,CONCAT71(local_a0._M_allocated_capacity._1_7_,local_a0._M_local_buf[0])
                             + 1);
  }
  if (2 < verbose_level) {
    EntryDebugString<std::_Rb_tree_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
              ((string *)local_80,this,
               (_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>)
               iVar3._M_node);
    printf("  added entry: %s\n",local_80._0_8_);
    if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
      operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
    }
  }
  return;
}

Assistant:

void RangeMap::AddDualRange(uint64_t addr, uint64_t size, uint64_t otheraddr,
                            const std::string& label) {
  if (verbose_level > 2) {
    printf("%p AddDualRange([%" PRIx64 ", %" PRIx64 "], %" PRIx64 ", %s)\n",
           this, addr, size, otheraddr, label.c_str());
  }

  if (size == 0) return;

  auto it = FindContainingOrAfter(addr);

  if (size == kUnknownSize) {
    assert(otheraddr == kNoTranslation);
    if (it != mappings_.end() && EntryContainsStrict(it, addr)) {
      MaybeSetLabel(it, label, addr, kUnknownSize);
    } else {
      auto iter = mappings_.emplace_hint(
          it, std::make_pair(addr, Entry(label, kUnknownSize, kNoTranslation)));
      if (verbose_level > 2) {
        printf("  added entry: %s\n", EntryDebugString(iter).c_str());
      }
    }
    return;
  }

  const uint64_t base = addr;
  uint64_t end = addr + size;
  assert(end >= addr);

  while (1) {
    // Advance past existing entries that intersect this range until we find a
    // gap.
    while (addr < end && !IterIsEnd(it) && EntryContains(it, addr)) {
      assert(end >= addr);
      MaybeSetLabel(it, label, addr, end - addr);
      addr = RangeEndUnknownLimit(it, addr);
      ++it;
    }

    if (addr >= end) {
      return;
    }

    // We found a gap and need to create an entry.  Need to make sure the new
    // entry doesn't extend into a range that was previously defined.
    uint64_t this_end = end;
    if (it != mappings_.end() && end > it->first) {
      assert(it->first >= addr);
      this_end = std::min(end, it->first);
    }

    uint64_t other = (otheraddr == kNoTranslation) ? kNoTranslation
                                                   : addr - base + otheraddr;
    assert(this_end >= addr);
    auto iter = mappings_.emplace_hint(
        it, std::make_pair(addr, Entry(label, this_end - addr, other)));
    if (verbose_level > 2) {
      printf("  added entry: %s\n", EntryDebugString(iter).c_str());
    }
    CheckConsistency(iter);
    addr = this_end;
  }
}